

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O0

void data_sheet_callback_data_initialize
               (data_sheet_callback_data *data,sharedstringlist *sharedstrings,uint flags,
               xlsxioread_process_cell_callback_fn cell_callback,
               xlsxioread_process_row_callback_fn row_callback,void *callbackdata)

{
  void *callbackdata_local;
  xlsxioread_process_row_callback_fn row_callback_local;
  xlsxioread_process_cell_callback_fn cell_callback_local;
  uint flags_local;
  sharedstringlist *sharedstrings_local;
  data_sheet_callback_data *data_local;
  
  data->xmlparser = (XML_Parser)0x0;
  data->sharedstrings = sharedstrings;
  data->rownr = 0;
  data->colnr = 0;
  data->cols = 0;
  data->colsnotnull = 0;
  data->celldata = (XML_Char *)0x0;
  data->celldatalen = 0;
  data->cell_string_type = none;
  data->flags = flags;
  data->skiptag = (XML_Char *)0x0;
  data->skiptagcount = 0;
  data->skip_start = (XML_StartElementHandler)0x0;
  data->skip_end = (XML_EndElementHandler)0x0;
  data->skip_data = (XML_CharacterDataHandler)0x0;
  data->sheet_cell_callback = cell_callback;
  data->sheet_row_callback = row_callback;
  data->callbackdata = callbackdata;
  return;
}

Assistant:

void data_sheet_callback_data_initialize (struct data_sheet_callback_data* data, struct sharedstringlist* sharedstrings, unsigned int flags, xlsxioread_process_cell_callback_fn cell_callback, xlsxioread_process_row_callback_fn row_callback, void* callbackdata)
{
  data->xmlparser = NULL;
  data->sharedstrings = sharedstrings;
  data->rownr = 0;
  data->colnr = 0;
  data->cols = 0;
  data->colsnotnull = 0;
  data->celldata = NULL;
  data->celldatalen = 0;
  data->cell_string_type = none;
  data->flags = flags;
  data->skiptag = NULL;
  data->skiptagcount = 0;
  data->skip_start = NULL;
  data->skip_end = NULL;
  data->skip_data = NULL;
  data->sheet_cell_callback = cell_callback;
  data->sheet_row_callback = row_callback;
  data->callbackdata = callbackdata;
}